

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Daemon.cpp
# Opt level: O0

Response execute_command(IteratorPopCommand *cmd,Task *task,DatabaseSnapshot *snap)

{
  json_value extraout_RDX;
  IteratorPopCommand *in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  Response RVar1;
  uint64_t total_files;
  uint64_t iterator_position;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  out;
  uint64_t *in_stack_00000208;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000210;
  int in_stack_0000021c;
  string *in_stack_00000220;
  Task *in_stack_00000228;
  DatabaseSnapshot *in_stack_00000230;
  uint64_t *in_stack_00000240;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  
  this = in_RDI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x15512b);
  IteratorPopCommand::get_iterator_id_abi_cxx11_(in_RSI);
  IteratorPopCommand::elements_to_pop(in_RSI);
  DatabaseSnapshot::read_iterator
            (in_stack_00000230,in_stack_00000228,in_stack_00000220,in_stack_0000021c,
             in_stack_00000210,in_stack_00000208,in_stack_00000240);
  Response::select_from_iterator
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)out.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish,
             (uint64_t)
             out.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,iterator_position);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(this);
  RVar1.content.m_value.object = extraout_RDX.object;
  RVar1.content._0_8_ = in_RDI;
  return (Response)RVar1.content;
}

Assistant:

Response execute_command(const IteratorPopCommand &cmd, Task *task,
                         const DatabaseSnapshot *snap) {
    std::vector<std::string> out;
    uint64_t iterator_position;
    uint64_t total_files;
    snap->read_iterator(task, cmd.get_iterator_id(), cmd.elements_to_pop(),
                        &out, &iterator_position, &total_files);

    return Response::select_from_iterator(out, iterator_position, total_files);
}